

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_psrlw_mips(uint64_t fs,uint64_t ft)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  LMIValue vs;
  
  uVar3 = (uint)ft & 0x7f;
  if (0x1f < uVar3) {
    return 0;
  }
  vs.d = fs;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    puVar1 = (uint *)((long)&vs + lVar2 * 4);
    *puVar1 = *puVar1 >> ((byte)uVar3 & 0x1f);
  }
  return vs.d;
}

Assistant:

uint64_t helper_psrlw(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 31) {
        return 0;
    }
    vs.d = fs;
    for (i = 0; i < 2; ++i) {
        vs.uw[i] >>= ft;
    }
    return vs.d;
}